

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_util.c
# Opt level: O1

long tvdiff(timeval newer,timeval older)

{
  return (newer.tv_usec - older.tv_usec) / 1000 + (newer.tv_sec - older.tv_sec) * 1000;
}

Assistant:

long tvdiff(struct timeval newer, struct timeval older)
{
  return (long)(newer.tv_sec-older.tv_sec)*1000+
    (long)(newer.tv_usec-older.tv_usec)/1000;
}